

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3d.h
# Opt level: O0

m3dtr_t * m3d_frame(m3d_t *model,M3D_INDEX actionid,M3D_INDEX frameid,m3dtr_t *skeleton)

{
  m3dfr_t *pmVar1;
  m3dfr_t *fr;
  M3D_INDEX s;
  uint i;
  m3dtr_t *skeleton_local;
  M3D_INDEX frameid_local;
  M3D_INDEX actionid_local;
  m3d_t *model_local;
  
  if ((((model == (m3d_t *)0x0) || (model->numbone == 0)) || (model->bone == (m3db_t *)0x0)) ||
     ((actionid != 0xffffffff &&
      (((model->action == (m3da_t *)0x0 || (model->numaction <= actionid)) ||
       (model->action[actionid].numframe <= frameid)))))) {
    model->errcode = -0x45;
    return skeleton;
  }
  model->errcode = '\0';
  if (skeleton == (m3dtr_t *)0x0) {
    _s = (m3dtr_t *)malloc((ulong)model->numbone * 0xc);
    if (_s == (m3dtr_t *)0x0) {
      model->errcode = -1;
      return (m3dtr_t *)0x0;
    }
  }
  else {
    _s = skeleton;
    if ((actionid != 0xffffffff) && (fr._0_4_ = frameid, frameid != 0)) goto LAB_006e9656;
  }
  fr._0_4_ = 0;
  for (fr._4_4_ = 0; fr._4_4_ < model->numbone; fr._4_4_ = fr._4_4_ + 1) {
    _s[fr._4_4_].boneid = fr._4_4_;
    _s[fr._4_4_].pos = model->bone[fr._4_4_].pos;
    _s[fr._4_4_].ori = model->bone[fr._4_4_].ori;
  }
LAB_006e9656:
  if ((actionid < model->numaction) &&
     ((frameid != 0 || ((model->action[actionid].frame)->msec == 0)))) {
    for (; (M3D_INDEX)fr <= frameid; fr._0_4_ = (M3D_INDEX)fr + 1) {
      pmVar1 = model->action[actionid].frame;
      for (fr._4_4_ = 0; fr._4_4_ < pmVar1[(M3D_INDEX)fr].numtransform; fr._4_4_ = fr._4_4_ + 1) {
        _s[pmVar1[(M3D_INDEX)fr].transform[fr._4_4_].boneid].pos =
             pmVar1[(M3D_INDEX)fr].transform[fr._4_4_].pos;
        _s[pmVar1[(M3D_INDEX)fr].transform[fr._4_4_].boneid].ori =
             pmVar1[(M3D_INDEX)fr].transform[fr._4_4_].ori;
      }
    }
  }
  return _s;
}

Assistant:

m3dtr_t *m3d_frame(m3d_t *model, M3D_INDEX actionid, M3D_INDEX frameid, m3dtr_t *skeleton)
{
    unsigned int i;
    M3D_INDEX s = frameid;
    m3dfr_t *fr;

    if(!model || !model->numbone || !model->bone || (actionid != M3D_UNDEF && (!model->action ||
        actionid >= model->numaction || frameid >= model->action[actionid].numframe))) {
            model->errcode = M3D_ERR_UNKFRAME;
            return skeleton;
    }
    model->errcode = M3D_SUCCESS;
    if(!skeleton) {
        skeleton = (m3dtr_t*)M3D_MALLOC(model->numbone * sizeof(m3dtr_t));
        if(!skeleton) {
            model->errcode = M3D_ERR_ALLOC;
            return NULL;
        }
        goto gen;
    }
    if(actionid == M3D_UNDEF || !frameid) {
gen:    s = 0;
        for(i = 0; i < model->numbone; i++) {
            skeleton[i].boneid = i;
            skeleton[i].pos = model->bone[i].pos;
            skeleton[i].ori = model->bone[i].ori;
        }
    }
    if(actionid < model->numaction && (frameid || !model->action[actionid].frame[0].msec)) {
        for(; s <= frameid; s++) {
            fr = &model->action[actionid].frame[s];
            for(i = 0; i < fr->numtransform; i++) {
                skeleton[fr->transform[i].boneid].pos = fr->transform[i].pos;
                skeleton[fr->transform[i].boneid].ori = fr->transform[i].ori;
            }
        }
    }
    return skeleton;
}